

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

TProb Cipher::calcScore(TParameters *params,TFreqMap *freqMap,
                       vector<int,_std::allocator<int>_> *plain,
                       vector<float,_std::allocator<float>_> *memo)

{
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  *this;
  pointer piVar1;
  long lVar2;
  const_iterator cVar3;
  TProb *pTVar4;
  TFreqMap *pTVar5;
  pointer pfVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  float fVar13;
  uint local_cc;
  TFreqMap *local_c8;
  vector<float,_std::allocator<float>_> *local_c0;
  float local_b8;
  float local_b4;
  vector<int,_std::allocator<int>_> *local_b0;
  TParameters *local_a8;
  array<int,_28UL> letCount;
  
  uVar10 = (ulong)((long)(plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  local_cc = 0;
  local_c8 = freqMap;
  local_c0 = memo;
  local_a8 = params;
  std::array<int,_28UL>::fill(&letCount,(value_type_conflict1 *)&local_cc);
  piVar1 = (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = 0;
  iVar9 = (int)uVar10;
  uVar11 = 0;
  if (0 < iVar9) {
    uVar11 = uVar10 & 0xffffffff;
  }
  iVar8 = 0;
  for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
    uVar10 = (ulong)(uint)piVar1[uVar7];
    if (uVar10 < 0x1c) {
      letCount._M_elems[uVar10] = letCount._M_elems[uVar10] + 1;
      iVar8 = iVar8 + 1;
    }
  }
  local_b8 = 0.0;
  for (lVar2 = 0; lVar2 != 0x70; lVar2 = lVar2 + 4) {
    fVar13 = *(float *)((long)&(anonymous_namespace)::kEnglishLetterWithSpacesFreq + lVar2) * 0.01 -
             (float)*(int *)((long)letCount._M_elems + lVar2) / (float)iVar8;
    local_b8 = local_b8 + fVar13 * fVar13;
  }
  local_b8 = local_b8 / 28.0;
  local_b0 = plain;
  if (local_b8 < 0.0) {
    local_b8 = sqrtf(local_b8);
  }
  else {
    local_b8 = SQRT(local_b8);
  }
  iVar8 = local_c8->len;
  local_cc = 0;
  this = &local_c8->prob;
  iVar12 = 0;
  lVar2 = 0;
  while( true ) {
    if (iVar8 + iVar12 < 1) {
      pfVar6 = (local_c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_b4 = *(float *)((long)pfVar6 + lVar2 + -4);
      if (0.5 < local_b4) {
        cVar3 = std::
                _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this->_M_h,(key_type *)&local_cc);
        if (cVar3.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur ==
            (__node_type *)0x0) {
          pTVar4 = &local_c8->pmin;
        }
        else {
          pTVar4 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,(key_type *)&local_cc);
        }
        local_b4 = *pTVar4;
        pfVar6 = (local_c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *(float *)((long)pfVar6 + lVar2 + -4) = local_b4;
      }
      iVar12 = -iVar12;
      local_b4 = local_b4 + 0.0;
      local_c8 = (TFreqMap *)&local_c8->pmin;
      do {
        local_cc = (local_cc & ~(-1 << ((char)iVar8 * '\x05' - 5U & 0x1f))) * 0x20 +
                   *(int *)((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar2);
        fVar13 = *(float *)((long)pfVar6 + lVar2);
        if (0.5 < fVar13) {
          cVar3 = std::
                  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&this->_M_h,(key_type *)&local_cc);
          pTVar5 = local_c8;
          if (cVar3.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur !=
              (__node_type *)0x0) {
            pTVar5 = (TFreqMap *)
                     std::__detail::
                     _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,(key_type *)&local_cc);
          }
          fVar13 = *(float *)pTVar5;
          pfVar6 = (local_c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          *(float *)((long)pfVar6 + lVar2) = fVar13;
        }
        local_b4 = local_b4 + fVar13;
        lVar2 = lVar2 + 4;
        iVar12 = iVar12 + 1;
      } while (iVar12 < iVar9);
      return local_b4 / (float)iVar9 - local_b8 * local_a8->wEnglishFreq;
    }
    if (uVar11 * 4 == lVar2) break;
    local_cc = local_cc * 0x20 +
               *(int *)((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar2);
    lVar2 = lVar2 + 4;
    iVar12 = iVar12 + -1;
  }
  return -INFINITY;
}

Assistant:

TProb calcScore(
            const TParameters & params,
            const TFreqMap & freqMap,
            const std::vector<TLetter> & plain,
                  std::vector<TProb> & memo) {
        TProb res = 0.0;

        const int n = plain.size();
        const auto & len  = freqMap.len;
        const auto & prob = freqMap.prob;

        int nlet = 0;
        std::array<int, 28> letCount;
        letCount.fill(0);
        for (int i = 0; i < n; ++i) {
            if (plain[i] >= 0 && plain[i] <= 27) {
                ++letCount[plain[i]];
                ++nlet;
            }
        }

        float letFreqCost = 0.0;
        {
            auto & freq = kEnglishLetterWithSpacesFreq;
            for (int i = 0; i <= 27; ++i) {
                float curf = 0.01*freq[i] - ((float)(letCount[i]))/((float)(nlet));
                letFreqCost += curf*curf;
            }
        }

        letFreqCost /= 28.0;
        letFreqCost = sqrt(letFreqCost);

        int i1 = 0;
        int k = len;
        TCode curc = 0;
        TCode mask = (1 << 5*(len-1)) - 1;

        while (k > 0) {
            if (i1 >= n) return -1e100;
            auto c = plain[i1++];
            curc <<= 5;
            curc += c;
            --k;
        }

        if (memo[i1 - 1] > 0.5) {
            memo[i1 - 1] = prob.find(curc) == prob.end() ? freqMap.pmin : prob.at(curc);
        }
        res += memo[i1 - 1];

        while (true) {
            curc &= mask;

            auto c = plain[i1++];
            curc <<= 5;
            curc += c;

            if (memo[i1 - 1] > 0.5) {
                memo[i1 - 1] = prob.find(curc) == prob.end() ? freqMap.pmin : prob.at(curc);
            }
            res += memo[i1 - 1];

            if (i1 >= n) break;
        }

        return res/n - params.wEnglishFreq*letFreqCost;
    }